

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

int __thiscall storage::BTLeafNode::erase_(BTLeafNode *this,int key,Record **out_record,bool *out)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  BTNode *pBVar4;
  BTLeafNode *this_00;
  BTLeafNode *this_01;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool *out_00;
  long lVar14;
  bool a_3;
  bool a_2;
  bool a_1;
  bool a;
  Record *rec;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  long local_50;
  BTNode *local_48;
  BTLeafNode *local_40;
  Record *local_38;
  
  *out = true;
  iVar13 = (this->super_BTNode).used_links_count_;
  iVar3 = -1;
  iVar11 = iVar13 + -2;
  iVar10 = 0;
  do {
    iVar12 = iVar10;
    iVar8 = iVar11;
    if (iVar8 < iVar12) break;
    iVar9 = (iVar8 - iVar12 >> 1) + iVar12;
    iVar1 = (this->super_BTNode).keys_[iVar9];
    iVar11 = iVar8;
    iVar10 = iVar12;
    if (iVar1 == key) {
      *out_record = this->record_links_[iVar9];
      iVar3 = iVar9;
    }
    else if (key < iVar1) {
      iVar11 = iVar9 + -1;
    }
    else {
      iVar10 = iVar9 + 1;
    }
  } while (iVar1 != key);
  if (iVar8 < iVar12) {
    *out = false;
    return -1;
  }
  if ((0x19 < iVar13) || ((this->super_BTNode).parent_ == (BTNode *)0x0)) {
    uVar6 = (this->super_BTNode).used_links_count_ - 1;
    uVar7 = (ulong)uVar6;
    if (iVar3 + 1 < (int)uVar6) {
      lVar5 = (long)(iVar3 + 1);
      do {
        (this->super_BTNode).keys_[iVar3] = (this->super_BTNode).keys_[lVar5];
        this->record_links_[iVar3] = this->record_links_[lVar5];
        lVar5 = lVar5 + 1;
        uVar7 = (long)(this->super_BTNode).used_links_count_ - 1;
        iVar3 = iVar3 + 1;
      } while (lVar5 < (long)uVar7);
    }
    (this->super_BTNode).used_links_count_ = (int)uVar7;
    return -1;
  }
  pBVar4 = BTNode::get_left_brother(&this->super_BTNode);
  if (pBVar4 == (BTNode *)0x0) {
    this_00 = (BTLeafNode *)0x0;
  }
  else {
    this_00 = (BTLeafNode *)__dynamic_cast(pBVar4,&BTNode::typeinfo,&typeinfo,0);
  }
  pBVar4 = BTNode::get_right_brother(&this->super_BTNode);
  if (pBVar4 == (BTNode *)0x0) {
    this_01 = (BTLeafNode *)0x0;
  }
  else {
    this_01 = (BTLeafNode *)__dynamic_cast(pBVar4,&BTNode::typeinfo,&typeinfo,0);
  }
  if ((this_00 == (BTLeafNode *)0x0) ||
     (lVar5 = (long)(this_00->super_BTNode).used_links_count_, lVar5 < 0x1a)) {
    if ((this_01 == (BTLeafNode *)0x0) || ((this_01->super_BTNode).used_links_count_ < 0x1a)) {
      if (this_00 == (BTLeafNode *)0x0) {
        if (this_01 == (BTLeafNode *)0x0) {
          out_00 = (bool *)0x0;
          if ((this->super_BTNode).parent_ != (BTNode *)0x0) {
            __assert_fail("parent_ == nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                          ,0x212,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
          }
          goto LAB_00104a0d;
        }
        local_54 = false;
        iVar13 = (this->super_BTNode).child_index_;
        insert_(this,(this_01->super_BTNode).keys_[0],this_01->record_links_[0],&local_54);
        if (local_54 == false) {
          __assert_fail("a",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0x208,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
        }
        erase_(this,key,out_record,out);
        if (2 < (this_01->super_BTNode).used_links_count_) {
          lVar5 = 0x1d;
          do {
            insert_(this,(this_01->super_BTNode).keys_[lVar5 + -0x1c],
                    *(Record **)((this_01->super_BTNode).keys_ + lVar5 * 2 + -5),&local_54);
            if (local_54 == false) {
              __assert_fail("a",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0x20c,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
            }
            lVar14 = lVar5 + -0x1b;
            lVar5 = lVar5 + 1;
          } while (lVar14 < (long)(this_01->super_BTNode).used_links_count_ + -1);
        }
        this->next_ = this_01->next_;
      }
      else {
        iVar13 = (this->super_BTNode).child_index_;
        if (1 < (this->super_BTNode).used_links_count_) {
          lVar5 = 0;
          do {
            iVar11 = (this->super_BTNode).keys_[lVar5];
            if (iVar11 != key) {
              local_53 = false;
              insert_(this_00,iVar11,this->record_links_[lVar5],&local_53);
              if (local_53 == false) {
                __assert_fail("a",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                              ,0x200,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (long)(this->super_BTNode).used_links_count_ + -1);
        }
        iVar13 = iVar13 + -1;
        this_00->next_ = this->next_;
      }
      bVar2 = false;
      goto LAB_00104a0f;
    }
    local_48 = (this->super_BTNode).parent_;
    local_50 = (long)(this->super_BTNode).child_index_;
    iVar13 = (this_01->super_BTNode).keys_[0];
    local_40 = (BTLeafNode *)this_01->record_links_[0];
    local_38 = (Record *)0x0;
    local_52 = false;
    erase_(this_01,iVar13,&local_38,&local_52);
    if (local_52 == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1f2,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    out_00 = &local_52;
    insert_(this,iVar13,local_40,out_00);
    if (local_52 == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1f5,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    erase_(this,key,out_record,out);
    local_48->keys_[local_50] = (this_01->super_BTNode).keys_[0];
  }
  else {
    local_48 = (this->super_BTNode).parent_;
    local_50 = (long)(this->super_BTNode).child_index_;
    iVar13 = (this_00->super_BTNode).keys_[lVar5 + -2];
    local_51 = false;
    local_40 = this_00;
    insert_(this,iVar13,this_00->record_links_[lVar5 + -2],&local_51);
    if (local_51 == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1e4,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    out_00 = &local_51;
    erase_(local_40,iVar13,out_record,out_00);
    if (local_51 == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1e6,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    erase_(this,key,out_record,out);
    local_48->keys_[local_50 + -1] = iVar13;
  }
LAB_00104a0d:
  iVar13 = (int)out_00;
  bVar2 = true;
LAB_00104a0f:
  if (bVar2) {
    return -1;
  }
  return iVar13;
}

Assistant:

int BTLeafNode::erase_(int key, Record *&out_record, bool &out) {
        out = true;
        int index = -1;
        if (search_record(key, out_record, index)) {
            if (check_if_erase() || (parent_ == nullptr))               //only need erase
            {
                for (int i = index + 1; i < used_links_count_ - 1; ++i) {
                    keys_[i - 1] = keys_[i];
                    record_links_[i - 1] = record_links_[i];
                }
                used_links_count_--;
            } else {
                BTLeafNode *l = dynamic_cast<BTLeafNode *>(get_left_brother());
                BTLeafNode *r = dynamic_cast<BTLeafNode *>(get_right_brother());
                if (l && l->check_if_erase()) {
                    // move one from left brother
                    int &key_infl = parent_->keys_[child_index_ - 1];

                    int key_move = l->keys_[l->used_links_count_ - 2];
                    Record *record_move = l->record_links_[l->used_links_count_ - 2];

                    bool a = false;
                    insert_(key_move, record_move, a);
                    assert(a);
                    l->erase_(key_move, out_record, a);
                    assert(a);
                    erase_(key, out_record, out);
                    key_infl = key_move;
                } else if (r && r->check_if_erase()) {
                    // move one from right brother
                    int &key_infl = parent_->keys_[child_index_];

                    int key_move = r->keys_[0];
                    Record *record_move = r->record_links_[0];
                    Record *rec = nullptr;
                    bool a = false;
                    r->erase_(key_move, rec, a);
                    assert(a);

                    insert_(key_move, record_move, a);
                    assert(a);
                    erase_(key, out_record, out);
                    key_infl = r->keys_[0];
                } else {
                    if (l) {
                        int idx = child_index_ - 1;
                        for (int i = 0; i < used_links_count_ - 1; ++i) {
                            if (keys_[i] == key)
                                continue;
                            bool a = false;
                            l->insert_(keys_[i], record_links_[i], a);
                            assert(a);
                        }
                        l->next_ = this->next_;
                        return idx;
                    } else if (r) {
                        bool a = false;
                        int idx = child_index_;
                        insert_(r->keys_[0], r->record_links_[0], a);
                        assert(a);
                        erase_(key, out_record, out);
                        for (int i = 1; i < r->used_links_count_ - 1; ++i) {
                            insert_(r->keys_[i], r->record_links_[i], a);
                            assert(a);
                        }
                        this->next_ = r->next_;
                        return idx;
                    } else {
                        // this must be a root
                        assert(parent_ == nullptr);
                    }
                }
            }
        } else {
            out = false;
        }
        return -1;
    }